

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ParamNames * __thiscall
vkt::shaderexecutor::
Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,3,3>,tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
::doGetParamNames_abi_cxx11_
          (Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,3,3>,tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
           *this)

{
  int iVar1;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,3,3>,tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
  *local_10;
  Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  if (doGetParamNames[abi:cxx11]()::names_abi_cxx11_ == '\0') {
    local_10 = this;
    iVar1 = __cxa_guard_acquire(&doGetParamNames[abi:cxx11]()::names_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"a",&local_31);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"b",&local_69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"c",&local_91);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"d",&local_b9);
      Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Tuple4(&doGetParamNames[abi:cxx11]()::names_abi_cxx11_,&local_30,&local_68,&local_90,
               &local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
      std::__cxx11::string::~string((string *)&local_30);
      std::allocator<char>::~allocator(&local_31);
      __cxa_atexit(Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~Tuple4,&doGetParamNames[abi:cxx11]()::names_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&doGetParamNames[abi:cxx11]()::names_abi_cxx11_);
    }
  }
  return &doGetParamNames[abi:cxx11]()::names_abi_cxx11_;
}

Assistant:

virtual const ParamNames&	doGetParamNames	(void)							const
	{
		static ParamNames	names	("a", "b", "c", "d");
		return names;
	}